

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCOpenings.cpp
# Opt level: O2

void Assimp::IFC::InsertWindowContours
               (ContourVector *contours,
               vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *param_2,
               TempMesh *curmesh)

{
  pointer pPVar1;
  double *pdVar2;
  pointer pPVar3;
  pointer paVar4;
  pointer paVar5;
  long lVar6;
  byte bVar7;
  iterator iVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  size_t e;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  set<aiVector2t<double>,_Assimp::IFC::XYSorter,_std::allocator<aiVector2t<double>_>_> verts;
  ulong local_b0;
  reverse_iterator<__gnu_cxx::__normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>_>
  local_68;
  reverse_iterator<__gnu_cxx::__normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>_>
  local_60;
  key_type local_58;
  key_type local_48;
  
  uVar17 = 0;
  do {
    pPVar3 = (contours->
             super__Vector_base<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(contours->
                       super__Vector_base<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pPVar3) / 0x68) <= uVar17
       ) {
      return;
    }
    paVar4 = *(pointer *)
              &pPVar3[uVar17].contour.
               super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl;
    paVar5 = *(pointer *)
              ((long)&pPVar3[uVar17].contour.
                      super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                      _M_impl + 8);
    if (paVar4 != paVar5) {
      pPVar1 = pPVar3 + uVar17;
      lVar16 = (long)paVar5 - (long)paVar4;
      if (lVar16 == 0x40) {
        verts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             verts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
        verts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        verts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &verts._M_t._M_impl.super__Rb_tree_header._M_header;
        verts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        verts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             verts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        for (lVar16 = 0; lVar16 != 0x40; lVar16 = lVar16 + 0x10) {
          std::
          _Rb_tree<aiVector2t<double>,aiVector2t<double>,std::_Identity<aiVector2t<double>>,Assimp::IFC::XYSorter,std::allocator<aiVector2t<double>>>
          ::_M_insert_unique<aiVector2t<double>const&>
                    ((_Rb_tree<aiVector2t<double>,aiVector2t<double>,std::_Identity<aiVector2t<double>>,Assimp::IFC::XYSorter,std::allocator<aiVector2t<double>>>
                      *)&verts,
                     (aiVector2t<double> *)
                     (*(long *)&(pPVar1->contour).
                                super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                                ._M_impl + lVar16));
        }
        iVar8 = std::
                _Rb_tree<aiVector2t<double>,_aiVector2t<double>,_std::_Identity<aiVector2t<double>_>,_Assimp::IFC::XYSorter,_std::allocator<aiVector2t<double>_>_>
                ::find(&verts._M_t,&pPVar3[uVar17].bb.first);
        if (((_Rb_tree_header *)iVar8._M_node != &verts._M_t._M_impl.super__Rb_tree_header) &&
           (iVar8 = std::
                    _Rb_tree<aiVector2t<double>,_aiVector2t<double>,_std::_Identity<aiVector2t<double>_>,_Assimp::IFC::XYSorter,_std::allocator<aiVector2t<double>_>_>
                    ::find(&verts._M_t,&(pPVar1->bb).second),
           (_Rb_tree_header *)iVar8._M_node != &verts._M_t._M_impl.super__Rb_tree_header)) {
          local_58.x = (pPVar1->bb).first.x;
          local_58.y = (pPVar1->bb).second.y;
          iVar8 = std::
                  _Rb_tree<aiVector2t<double>,_aiVector2t<double>,_std::_Identity<aiVector2t<double>_>,_Assimp::IFC::XYSorter,_std::allocator<aiVector2t<double>_>_>
                  ::find(&verts._M_t,&local_58);
          if ((_Rb_tree_header *)iVar8._M_node != &verts._M_t._M_impl.super__Rb_tree_header) {
            local_48.y = (pPVar1->bb).first.y;
            local_48.x = (pPVar1->bb).second.x;
            iVar8 = std::
                    _Rb_tree<aiVector2t<double>,_aiVector2t<double>,_std::_Identity<aiVector2t<double>_>,_Assimp::IFC::XYSorter,_std::allocator<aiVector2t<double>_>_>
                    ::find(&verts._M_t,&local_48);
            if ((_Rb_tree_header *)iVar8._M_node != &verts._M_t._M_impl.super__Rb_tree_header) {
              std::
              _Rb_tree<aiVector2t<double>,_aiVector2t<double>,_std::_Identity<aiVector2t<double>_>,_Assimp::IFC::XYSorter,_std::allocator<aiVector2t<double>_>_>
              ::~_Rb_tree(&verts._M_t);
              goto LAB_00504ff6;
            }
          }
        }
        std::
        _Rb_tree<aiVector2t<double>,_aiVector2t<double>,_std::_Identity<aiVector2t<double>_>,_Assimp::IFC::XYSorter,_std::allocator<aiVector2t<double>_>_>
        ::~_Rb_tree(&verts._M_t);
        lVar16 = (long)*(pointer *)
                        ((long)&(pPVar1->contour).
                                super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                                ._M_impl + 8) -
                 *(long *)&(pPVar1->contour).
                           super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                           ._M_impl;
      }
      dVar20 = (pPVar1->bb).first.x - (pPVar1->bb).second.x;
      dVar21 = (pPVar1->bb).first.y - (pPVar1->bb).second.y;
      dVar20 = SQRT(dVar20 * dVar20 + dVar21 * dVar21);
      dVar24 = dVar20 / 1000.0;
      uVar19 = lVar16 >> 4;
      dVar21 = 0.0;
      dVar26 = 0.0;
      local_b0 = 0xffffffffffffffff;
      uVar12 = 0;
      uVar14 = 0xffffffffffffffff;
      for (lVar18 = 0; lVar18 != lVar16 >> 3; lVar18 = lVar18 + 1) {
        lVar9 = *(long *)&(pPVar1->contour).
                          super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                          ._M_impl;
        dVar22 = *(double *)(lVar9 + uVar12 * 0x10);
        dVar27 = (pPVar1->bb).first.x;
        bVar7 = 1;
        if ((dVar24 <= ABS(dVar22 - dVar27)) &&
           (dVar27 = (pPVar1->bb).second.x, dVar24 <= ABS(dVar22 - dVar27))) {
          bVar7 = 0;
          dVar27 = dVar26;
        }
        dVar26 = dVar27;
        dVar22 = *(double *)(lVar9 + uVar12 * 0x10 + 8);
        dVar27 = (pPVar1->bb).first.y;
        if (ABS(dVar22 - dVar27) < dVar24) {
LAB_00504d5f:
          dVar21 = dVar27;
          uVar15 = uVar12;
          uVar10 = uVar12;
          if (uVar14 != 0xffffffffffffffff) {
            lVar9 = (long)(curmesh->mVerts).
                          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(curmesh->mVerts).
                          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
            uVar10 = 0;
            if (uVar12 < uVar14) {
              uVar10 = uVar19;
            }
            uVar10 = uVar10 + (uVar12 - uVar14);
            uVar11 = uVar14;
            for (uVar13 = 0; uVar13 <= uVar10; uVar13 = uVar13 + 1) {
              pdVar2 = (double *)
                       (*(long *)&(pPVar1->contour).
                                  super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                                  ._M_impl + uVar11 * 0x10);
              dVar22 = *pdVar2;
              dVar27 = pdVar2[1];
              dVar23 = dVar22 - dVar26;
              dVar25 = dVar27 - dVar21;
              if (dVar23 * dVar23 + dVar25 * dVar25 <= dVar20 * dVar20 * 0.7) {
                verts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                verts._M_t._M_impl._0_8_ = dVar22;
                verts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = dVar27;
                std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
                emplace_back<aiVector3t<double>>
                          ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)curmesh,
                           (aiVector3t<double> *)&verts);
              }
              uVar11 = (uVar11 + 1) % uVar19;
            }
            lVar6 = *(long *)&(pPVar1->contour).
                              super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                              ._M_impl;
            dVar22 = *(double *)(lVar6 + uVar14 * 0x10);
            dVar27 = *(double *)(lVar6 + 8 + uVar14 * 0x10);
            if ((((dVar26 != dVar22) || (NAN(dVar26) || NAN(dVar22))) || (dVar21 != dVar27)) ||
               (NAN(dVar21) || NAN(dVar27))) {
              verts._M_t._M_impl._0_8_ = pPVar3[uVar17].bb.first.x;
              if ((dVar24 <= ABS(dVar22 - (double)verts._M_t._M_impl._0_8_)) &&
                 (dVar23 = (pPVar1->bb).second.x, verts._M_t._M_impl._0_8_ = dVar26,
                 ABS(dVar22 - dVar23) < dVar24)) {
                verts._M_t._M_impl._0_8_ = dVar23;
              }
              verts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = (pPVar1->bb).first.y;
              if ((dVar24 <= ABS(dVar27 - (double)verts._M_t._M_impl.super__Rb_tree_header._M_header
                                                  ._0_8_)) &&
                 (dVar22 = (pPVar1->bb).second.y,
                 verts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = dVar21,
                 ABS(dVar27 - dVar22) < dVar24)) {
                verts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = dVar22;
              }
              verts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
              emplace_back<aiVector3t<double>>
                        ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)curmesh,
                         (aiVector3t<double> *)&verts);
            }
            else if (uVar10 == 1) {
              std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::erase
                        (&curmesh->mVerts,
                         (aiVector3t<double> *)
                         (lVar9 + (long)(curmesh->mVerts).
                                        super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start),
                         (curmesh->mVerts).
                         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
            }
            lVar9 = ((long)(curmesh->mVerts).
                           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(curmesh->mVerts).
                          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x18 - lVar9 / 0x18;
            if (lVar9 != 0) {
              verts._M_t._M_impl._0_4_ = (int)lVar9;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                        (&curmesh->mVertcnt,(uint *)&verts);
              local_60.current._M_current =
                   (__normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                    )(curmesh->mVerts).
                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
              local_68.current._M_current =
                   (__normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                    )((long)local_60.current._M_current + -lVar9 * 0x18);
              std::
              reverse<std::reverse_iterator<__gnu_cxx::__normal_iterator<aiVector3t<double>*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>>>
                        (&local_60,&local_68);
            }
            uVar10 = local_b0;
            if (uVar12 == local_b0) goto LAB_00504ff6;
          }
        }
        else {
          dVar27 = (pPVar1->bb).second.y;
          dVar22 = ABS(dVar22 - dVar27);
          if (dVar24 <= dVar22) {
            dVar27 = dVar21;
          }
          uVar15 = uVar14;
          uVar10 = local_b0;
          if ((bool)(bVar7 | dVar22 < dVar24)) goto LAB_00504d5f;
        }
        local_b0 = uVar10;
        uVar12 = (uVar12 + 1) % uVar19;
        uVar14 = uVar15;
      }
      LogFunctions<Assimp::IFCImporter>::LogError((char *)0x504ff6);
    }
LAB_00504ff6:
    uVar17 = uVar17 + 1;
  } while( true );
}

Assistant:

void InsertWindowContours(const ContourVector& contours,
    const std::vector<TempOpening>& /*openings*/,
    TempMesh& curmesh)
{
    // fix windows - we need to insert the real, polygonal shapes into the quadratic holes that we have now
    for(size_t i = 0; i < contours.size();++i) {
        const BoundingBox& bb = contours[i].bb;
        const std::vector<IfcVector2>& contour = contours[i].contour;
        if(contour.empty()) {
            continue;
        }

        // check if we need to do it at all - many windows just fit perfectly into their quadratic holes,
        // i.e. their contours *are* already their bounding boxes.
        if (contour.size() == 4) {
            std::set<IfcVector2,XYSorter> verts;
            for(size_t n = 0; n < 4; ++n) {
                verts.insert(contour[n]);
            }
            const std::set<IfcVector2,XYSorter>::const_iterator end = verts.end();
            if (verts.find(bb.first)!=end && verts.find(bb.second)!=end
                && verts.find(IfcVector2(bb.first.x,bb.second.y))!=end
                && verts.find(IfcVector2(bb.second.x,bb.first.y))!=end
                ) {
                    continue;
            }
        }

        const IfcFloat diag = (bb.first-bb.second).Length();
        const IfcFloat epsilon = diag/1000.f;

        // walk through all contour points and find those that lie on the BB corner
        size_t last_hit = -1, very_first_hit = -1;
        IfcVector2 edge;
        for(size_t n = 0, e=0, size = contour.size();; n=(n+1)%size, ++e) {

            // sanity checking
            if (e == size*2) {
                IFCImporter::LogError("encountered unexpected topology while generating window contour");
                break;
            }

            const IfcVector2& v = contour[n];

            bool hit = false;
            if (std::fabs(v.x-bb.first.x)<epsilon) {
                edge.x = bb.first.x;
                hit = true;
            }
            else if (std::fabs(v.x-bb.second.x)<epsilon) {
                edge.x = bb.second.x;
                hit = true;
            }

            if (std::fabs(v.y-bb.first.y)<epsilon) {
                edge.y = bb.first.y;
                hit = true;
            }
            else if (std::fabs(v.y-bb.second.y)<epsilon) {
                edge.y = bb.second.y;
                hit = true;
            }

            if (hit) {
                if (last_hit != (size_t)-1) {

                    const size_t old = curmesh.mVerts.size();
                    size_t cnt = last_hit > n ? size-(last_hit-n) : n-last_hit;
                    for(size_t a = last_hit, e = 0; e <= cnt; a=(a+1)%size, ++e) {
                        // hack: this is to fix cases where opening contours are self-intersecting.
                        // Clipper doesn't produce such polygons, but as soon as we're back in
                        // our brave new floating-point world, very small distances are consumed
                        // by the maximum available precision, leading to self-intersecting
                        // polygons. This fix makes concave windows fail even worse, but
                        // anyway, fail is fail.
                        if ((contour[a] - edge).SquareLength() > diag*diag*0.7) {
                            continue;
                        }
                        curmesh.mVerts.push_back(IfcVector3(contour[a].x, contour[a].y, 0.0f));
                    }

                    if (edge != contour[last_hit]) {

                        IfcVector2 corner = edge;

                        if (std::fabs(contour[last_hit].x-bb.first.x)<epsilon) {
                            corner.x = bb.first.x;
                        }
                        else if (std::fabs(contour[last_hit].x-bb.second.x)<epsilon) {
                            corner.x = bb.second.x;
                        }

                        if (std::fabs(contour[last_hit].y-bb.first.y)<epsilon) {
                            corner.y = bb.first.y;
                        }
                        else if (std::fabs(contour[last_hit].y-bb.second.y)<epsilon) {
                            corner.y = bb.second.y;
                        }

                        curmesh.mVerts.push_back(IfcVector3(corner.x, corner.y, 0.0f));
                    }
                    else if (cnt == 1) {
                        // avoid degenerate polygons (also known as lines or points)
                        curmesh.mVerts.erase(curmesh.mVerts.begin()+old,curmesh.mVerts.end());
                    }

                    if (const size_t d = curmesh.mVerts.size()-old) {
                        curmesh.mVertcnt.push_back(static_cast<unsigned int>(d));
                        std::reverse(curmesh.mVerts.rbegin(),curmesh.mVerts.rbegin()+d);
                    }
                    if (n == very_first_hit) {
                        break;
                    }
                }
                else {
                    very_first_hit = n;
                }

                last_hit = n;
            }
        }
    }
}